

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O2

StringCopyInfo * __thiscall
LargeStack<Js::StringCopyInfo>::Pop
          (StringCopyInfo *__return_storage_ptr__,LargeStack<Js::StringCopyInfo> *this)

{
  code *pcVar1;
  bool bVar2;
  Type *ppLVar3;
  undefined4 *puVar4;
  Type this_00;
  SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  
  ppLVar3 = SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
            Head(&this->blockStack->
                  super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                );
  this_00 = *ppLVar3;
  if (this_00->index == 0) {
    SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Pop
              (this->blockStack);
    this_01 = this->blockStack;
    if ((SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_01->
        super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == this_01) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/LargeStack.h"
                         ,0x50,"(!blockStack->Empty())","can\'t pop empty block stack");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      this_01 = this->blockStack;
    }
    ppLVar3 = SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
              Head(&this_01->
                    super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                  );
    this_00 = *ppLVar3;
  }
  LargeStackBlock<Js::StringCopyInfo>::Pop(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

T Pop() {
        LargeStackBlock<T>* top=blockStack->Top();
        if (top->Empty()) {
            blockStack->Pop();
            AssertMsg(!blockStack->Empty(),"can't pop empty block stack");
            top=blockStack->Top();
        }
        return top->Pop();
    }